

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

int Cudd_bddGenDisjDecomp(DdManager *dd,DdNode *f,DdNode ***disjuncts)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = Cudd_bddGenConjDecomp(dd,(DdNode *)((ulong)f ^ 1),disjuncts);
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    (*disjuncts)[uVar2] = (DdNode *)((ulong)(*disjuncts)[uVar2] ^ 1);
  }
  return uVar1;
}

Assistant:

int
Cudd_bddGenDisjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** disjuncts /* address of the array of the disjuncts */)
{
    int result, i;

    result = Cudd_bddGenConjDecomp(dd,Cudd_Not(f),disjuncts);
    for (i = 0; i < result; i++) {
        (*disjuncts)[i] = Cudd_Not((*disjuncts)[i]);
    }
    return(result);

}